

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

TimeZoneGenericNameMatchInfo * __thiscall
icu_63::TZGNCore::findLocal
          (TZGNCore *this,UnicodeString *text,int32_t start,uint32_t types,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  UVector *pUVar4;
  TZGNCore *pTVar5;
  StringEnumeration *pSVar6;
  undefined4 extraout_var;
  int32_t *piVar7;
  TZGNCore *local_120;
  TZGNCore *local_d0;
  UnicodeString *tzID;
  StringEnumeration *tzIDs;
  UVector *results;
  TZGNCore *pTStack_70;
  int32_t maxLen;
  TimeZoneGenericNameMatchInfo *gmatchInfo;
  TZGNCore *local_58;
  TZGNCore *nonConstThis;
  GNameSearchHandler handler;
  UErrorCode *status_local;
  uint32_t types_local;
  int32_t start_local;
  UnicodeString *text_local;
  TZGNCore *this_local;
  
  handler._24_8_ = status;
  GNameSearchHandler::GNameSearchHandler((GNameSearchHandler *)&nonConstThis,types);
  local_58 = this;
  umtx_lock_63((UMutex *)gLock);
  TextTrieMap::search(&this->fGNamesTrie,text,start,(TextTrieMapSearchResultHandler *)&nonConstThis,
                      (UErrorCode *)handler._24_8_);
  umtx_unlock_63((UMutex *)gLock);
  UVar1 = ::U_FAILURE(*(UErrorCode *)handler._24_8_);
  if (UVar1 == '\0') {
    pTStack_70 = (TZGNCore *)0x0;
    results._4_4_ = 0;
    piVar7 = (int32_t *)((long)&results + 4);
    pUVar4 = GNameSearchHandler::getMatches((GNameSearchHandler *)&nonConstThis,piVar7);
    iVar3 = results._4_4_;
    if ((pUVar4 == (UVector *)0x0) ||
       ((iVar2 = UnicodeString::length(text), iVar3 != iVar2 - start &&
        (this->fGNamesTrieFullyLoaded == '\0')))) {
      if ((pUVar4 != (UVector *)0x0) && (pUVar4 != (UVector *)0x0)) {
        (*(pUVar4->super_UObject)._vptr_UObject[1])();
      }
      umtx_lock_63((UMutex *)gLock);
      if (this->fGNamesTrieFullyLoaded == '\0') {
        pSVar6 = TimeZone::createTimeZoneIDEnumeration
                           (UCAL_ZONE_TYPE_CANONICAL,(char *)0x0,(int32_t *)0x0,
                            (UErrorCode *)handler._24_8_);
        UVar1 = ::U_SUCCESS(*(UErrorCode *)handler._24_8_);
        if (UVar1 != '\0') {
          while( true ) {
            iVar3 = (*(pSVar6->super_UObject)._vptr_UObject[7])(pSVar6,handler._24_8_);
            if (((UnicodeString *)CONCAT44(extraout_var,iVar3) == (UnicodeString *)0x0) ||
               (UVar1 = ::U_FAILURE(*(UErrorCode *)handler._24_8_), UVar1 != '\0')) break;
            loadStrings(local_58,(UnicodeString *)CONCAT44(extraout_var,iVar3));
          }
        }
        if ((pSVar6 != (StringEnumeration *)0x0) && (pSVar6 != (StringEnumeration *)0x0)) {
          (*(pSVar6->super_UObject)._vptr_UObject[1])();
        }
        UVar1 = ::U_SUCCESS(*(UErrorCode *)handler._24_8_);
        if (UVar1 != '\0') {
          local_58->fGNamesTrieFullyLoaded = '\x01';
        }
      }
      umtx_unlock_63((UMutex *)gLock);
      UVar1 = ::U_FAILURE(*(UErrorCode *)handler._24_8_);
      if (UVar1 == '\0') {
        umtx_lock_63((UMutex *)gLock);
        TextTrieMap::search(&this->fGNamesTrie,text,start,
                            (TextTrieMapSearchResultHandler *)&nonConstThis,
                            (UErrorCode *)handler._24_8_);
        umtx_unlock_63((UMutex *)gLock);
        piVar7 = (int32_t *)((long)&results + 4);
        pUVar4 = GNameSearchHandler::getMatches((GNameSearchHandler *)&nonConstThis,piVar7);
        if ((pUVar4 != (UVector *)0x0) && (0 < results._4_4_)) {
          pTVar5 = (TZGNCore *)UMemory::operator_new((UMemory *)0x8,(size_t)piVar7);
          local_120 = (TZGNCore *)0x0;
          if (pTVar5 != (TZGNCore *)0x0) {
            TimeZoneGenericNameMatchInfo::TimeZoneGenericNameMatchInfo
                      ((TimeZoneGenericNameMatchInfo *)pTVar5,pUVar4);
            local_120 = pTVar5;
          }
          pTStack_70 = local_120;
          if (local_120 == (TZGNCore *)0x0) {
            *(undefined4 *)handler._24_8_ = 7;
            if (pUVar4 != (UVector *)0x0) {
              (*(pUVar4->super_UObject)._vptr_UObject[1])();
            }
            this_local = (TZGNCore *)0x0;
            goto LAB_0023661c;
          }
        }
        this_local = pTStack_70;
      }
      else {
        this_local = (TZGNCore *)0x0;
      }
    }
    else {
      pTVar5 = (TZGNCore *)UMemory::operator_new((UMemory *)0x8,(size_t)piVar7);
      local_d0 = (TZGNCore *)0x0;
      if (pTVar5 != (TZGNCore *)0x0) {
        TimeZoneGenericNameMatchInfo::TimeZoneGenericNameMatchInfo
                  ((TimeZoneGenericNameMatchInfo *)pTVar5,pUVar4);
        local_d0 = pTVar5;
      }
      pTStack_70 = local_d0;
      if (local_d0 == (TZGNCore *)0x0) {
        *(undefined4 *)handler._24_8_ = 7;
        if (pUVar4 != (UVector *)0x0) {
          (*(pUVar4->super_UObject)._vptr_UObject[1])();
        }
        this_local = (TZGNCore *)0x0;
      }
      else {
        this_local = local_d0;
      }
    }
  }
  else {
    this_local = (TZGNCore *)0x0;
  }
LAB_0023661c:
  gmatchInfo._0_4_ = 1;
  GNameSearchHandler::~GNameSearchHandler((GNameSearchHandler *)&nonConstThis);
  return (TimeZoneGenericNameMatchInfo *)this_local;
}

Assistant:

TimeZoneGenericNameMatchInfo*
TZGNCore::findLocal(const UnicodeString& text, int32_t start, uint32_t types, UErrorCode& status) const {
    GNameSearchHandler handler(types);

    TZGNCore *nonConstThis = const_cast<TZGNCore *>(this);

    umtx_lock(&gLock);
    {
        fGNamesTrie.search(text, start, (TextTrieMapSearchResultHandler *)&handler, status);
    }
    umtx_unlock(&gLock);

    if (U_FAILURE(status)) {
        return NULL;
    }

    TimeZoneGenericNameMatchInfo *gmatchInfo = NULL;

    int32_t maxLen = 0;
    UVector *results = handler.getMatches(maxLen);
    if (results != NULL && ((maxLen == (text.length() - start)) || fGNamesTrieFullyLoaded)) {
        // perfect match
        gmatchInfo = new TimeZoneGenericNameMatchInfo(results);
        if (gmatchInfo == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            delete results;
            return NULL;
        }
        return gmatchInfo;
    }

    if (results != NULL) {
        delete results;
    }

    // All names are not yet loaded into the local trie.
    // Load all available names into the trie. This could be very heavy.
    umtx_lock(&gLock);
    {
        if (!fGNamesTrieFullyLoaded) {
            StringEnumeration *tzIDs = TimeZone::createTimeZoneIDEnumeration(UCAL_ZONE_TYPE_CANONICAL, NULL, NULL, status);
            if (U_SUCCESS(status)) {
                const UnicodeString *tzID;
                while ((tzID = tzIDs->snext(status)) != NULL) {
                    if (U_FAILURE(status)) {
                        break;
                    }
                    nonConstThis->loadStrings(*tzID);
                }
            }
            if (tzIDs != NULL) {
                delete tzIDs;
            }

            if (U_SUCCESS(status)) {
                nonConstThis->fGNamesTrieFullyLoaded = TRUE;
            }
        }
    }
    umtx_unlock(&gLock);

    if (U_FAILURE(status)) {
        return NULL;
    }

    umtx_lock(&gLock);
    {
        // now try it again
        fGNamesTrie.search(text, start, (TextTrieMapSearchResultHandler *)&handler, status);
    }
    umtx_unlock(&gLock);

    results = handler.getMatches(maxLen);
    if (results != NULL && maxLen > 0) {
        gmatchInfo = new TimeZoneGenericNameMatchInfo(results);
        if (gmatchInfo == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            delete results;
            return NULL;
        }
    }

    return gmatchInfo;
}